

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLinkDirectoriesCommand.cxx
# Opt level: O2

void __thiscall
cmLinkDirectoriesCommand::AddLinkDir
          (cmLinkDirectoriesCommand *this,string *dir,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *directories)

{
  cmMakefile *pcVar1;
  bool bVar2;
  PolicyStatus PVar3;
  ostream *poVar4;
  string *psVar5;
  PolicyID id;
  string tmp;
  string unixPath;
  ostringstream e;
  
  std::__cxx11::string::string((string *)&unixPath,(string *)dir);
  cmsys::SystemTools::ConvertToUnixSlashes(&unixPath);
  bVar2 = cmsys::SystemTools::FileIsFullPath(&unixPath);
  if ((bVar2) ||
     (((1 < unixPath._M_string_length && (*unixPath._M_dataplus._M_p == '$')) &&
      (unixPath._M_dataplus._M_p[1] == '<')))) goto LAB_00199613;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&e);
  poVar4 = std::operator<<((ostream *)&e,"This command specifies the relative path\n");
  poVar4 = std::operator<<(poVar4,"  ");
  poVar4 = std::operator<<(poVar4,(string *)&unixPath);
  poVar4 = std::operator<<(poVar4,"\n");
  std::operator<<(poVar4,"as a link directory.\n");
  PVar3 = cmMakefile::GetPolicyStatus((this->super_cmCommand).Makefile,CMP0015,false);
  if (PVar3 - REQUIRED_IF_USED < 2) {
    cmPolicies::GetRequiredPolicyError_abi_cxx11_(&tmp,(cmPolicies *)0xf,id);
    std::operator<<((ostream *)&e,(string *)&tmp);
    std::__cxx11::string::~string((string *)&tmp);
    pcVar1 = (this->super_cmCommand).Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar1,FATAL_ERROR,&tmp);
    std::__cxx11::string::~string((string *)&tmp);
LAB_00199570:
    psVar5 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_((this->super_cmCommand).Makefile);
    std::__cxx11::string::string((string *)&tmp,(string *)psVar5);
    std::__cxx11::string::append((char *)&tmp);
    std::__cxx11::string::append((string *)&tmp);
    std::__cxx11::string::_M_assign((string *)&unixPath);
LAB_001995ff:
    std::__cxx11::string::~string((string *)&tmp);
  }
  else {
    if (PVar3 == WARN) {
      cmPolicies::GetPolicyWarning_abi_cxx11_(&tmp,(cmPolicies *)0xf,id);
      std::operator<<((ostream *)&e,(string *)&tmp);
      std::__cxx11::string::~string((string *)&tmp);
      pcVar1 = (this->super_cmCommand).Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar1,AUTHOR_WARNING,&tmp);
      goto LAB_001995ff;
    }
    if (PVar3 == NEW) goto LAB_00199570;
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&e);
LAB_00199613:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(directories,&unixPath);
  std::__cxx11::string::~string((string *)&unixPath);
  return;
}

Assistant:

void cmLinkDirectoriesCommand::AddLinkDir(
  std::string const& dir, std::vector<std::string>& directories)
{
  std::string unixPath = dir;
  cmSystemTools::ConvertToUnixSlashes(unixPath);
  if (!cmSystemTools::FileIsFullPath(unixPath) &&
      !cmGeneratorExpression::StartsWithGeneratorExpression(unixPath)) {
    bool convertToAbsolute = false;
    std::ostringstream e;
    /* clang-format off */
    e << "This command specifies the relative path\n"
      << "  " << unixPath << "\n"
      << "as a link directory.\n";
    /* clang-format on */
    switch (this->Makefile->GetPolicyStatus(cmPolicies::CMP0015)) {
      case cmPolicies::WARN:
        e << cmPolicies::GetPolicyWarning(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, e.str());
        break;
      case cmPolicies::OLD:
        // OLD behavior does not convert
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        e << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0015);
        this->Makefile->IssueMessage(MessageType::FATAL_ERROR, e.str());
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior converts
        convertToAbsolute = true;
        break;
    }
    if (convertToAbsolute) {
      std::string tmp = this->Makefile->GetCurrentSourceDirectory();
      tmp += "/";
      tmp += unixPath;
      unixPath = tmp;
    }
  }
  directories.push_back(unixPath);
}